

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::GreaterThan,_true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  idx_t iVar1;
  SelectionVector *in_RCX;
  SelectionVector *in_RDX;
  SelectionVector *in_RSI;
  hugeint_t *in_RDI;
  idx_t in_R8;
  ValidityMask *unaff_retaddr;
  ValidityMask *in_stack_00000008;
  SelectionVector *in_stack_00000010;
  SelectionVector *in_stack_00000018;
  long in_stack_00000020;
  hugeint_t *in_stack_fffffffffffffff0;
  
  if ((in_stack_00000018 == (SelectionVector *)0x0) || (in_stack_00000020 == 0)) {
    if (in_stack_00000018 == (SelectionVector *)0x0) {
      iVar1 = SelectGenericLoop<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::GreaterThan,_true,_false,_true>
                        (in_stack_fffffffffffffff0,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,unaff_retaddr,
                         in_stack_00000008,in_stack_00000010,(SelectionVector *)0x0);
    }
    else {
      iVar1 = SelectGenericLoop<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::GreaterThan,_true,_true,_false>
                        (in_stack_fffffffffffffff0,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,unaff_retaddr,
                         in_stack_00000008,in_stack_00000010,in_stack_00000018);
    }
  }
  else {
    iVar1 = SelectGenericLoop<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::GreaterThan,_true,_true,_true>
                      (in_stack_fffffffffffffff0,in_RDI,in_RSI,in_RDX,in_RCX,in_R8,unaff_retaddr,
                       in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  return iVar1;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}